

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

int Nwk_ManMinimumBaseInt(Nwk_Man_t *pNtk,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vTruth_00;
  Nwk_Obj_t *p;
  uint local_30;
  int local_2c;
  int Counter;
  int i;
  Nwk_Obj_t *pObj;
  Vec_Int_t *vTruth;
  int fVerbose_local;
  Nwk_Man_t *pNtk_local;
  
  local_30 = 0;
  vTruth_00 = Vec_IntAlloc(0x10000);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,local_2c);
    if ((p != (Nwk_Obj_t *)0x0) && (iVar1 = Nwk_ObjIsNode(p), iVar1 != 0)) {
      iVar1 = Nwk_ManMinimumBaseNode(p,vTruth_00,fVerbose);
      local_30 = iVar1 + local_30;
    }
  }
  if ((fVerbose != 0) && (local_30 != 0)) {
    printf("Support minimization reduced support of %d nodes.\n",(ulong)local_30);
  }
  Vec_IntFree(vTruth_00);
  return local_30;
}

Assistant:

int Nwk_ManMinimumBaseInt( Nwk_Man_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTruth;
    Nwk_Obj_t * pObj;
    int i, Counter = 0;
    vTruth = Vec_IntAlloc( 1 << 16 );
    Nwk_ManForEachNode( pNtk, pObj, i )
        Counter += Nwk_ManMinimumBaseNode( pObj, vTruth, fVerbose );
    if ( fVerbose && Counter )
        printf( "Support minimization reduced support of %d nodes.\n", Counter );
    Vec_IntFree( vTruth );
    return Counter;
}